

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  cTValue *in_RDX;
  GCtab *in_RSI;
  uint32_t i;
  uint32_t na;
  uint32_t asize;
  uint32_t total;
  uint32_t bins [28];
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t local_88 [14];
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  GCtab *in_stack_ffffffffffffffb8;
  lua_State *in_stack_ffffffffffffffc0;
  
  for (uVar4 = 0; uVar4 < 0x1c; uVar4 = uVar4 + 1) {
    local_88[uVar4] = 0;
  }
  uVar2 = countarray(in_RSI,local_88);
  iVar3 = uVar2 + 1;
  uVar2 = counthash((GCtab *)CONCAT44(iVar3,uVar2),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffff6c,uVar4),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  iVar3 = uVar2 + iVar3;
  countint(in_RDX,local_88);
  uVar2 = bestasize(local_88,(uint32_t *)&stack0xffffffffffffff70);
  iVar3 = iVar3 - uVar2;
  if ((iVar3 != 0) && (iVar3 != 1)) {
    iVar1 = 0x1f;
    if (iVar3 - 1U != 0) {
      for (; iVar3 - 1U >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
  }
  resizetab(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
            in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  resizetab(L, t, asize, hsize2hbits(total));
}